

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_TestMobjZ(AActor *actor,bool quick,AActor **pOnmobj)

{
  double dVar1;
  AActor *pAVar2;
  double dVar3;
  double dVar4;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar5;
  bool bVar6;
  uint uVar7;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar8;
  CheckResult cres;
  FPortalGroupArray check;
  FMultiBlockThingsIterator it;
  int local_228;
  int local_224;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_220;
  double local_218;
  double local_210;
  FPortalGroupArray local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  if (((actor->flags).Value & 0x1000) != 0) {
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = (AActor *)0x0;
    }
    return true;
  }
  local_1f8.data.Array = (unsigned_short *)0x0;
  local_1f8.data.Most = 0;
  local_1f8.data.Count = 0;
  local_1f8.method = 1;
  local_1f8.varused = '\0';
  local_1f8.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator(&local_1d0,&local_1f8,actor,-1.0,true);
  aVar8.p = (AActor *)0x0;
LAB_0053bdb6:
LAB_0053bdc7:
  do {
    bVar6 = FMultiBlockThingsIterator::Next(&local_1d0,(CheckResult *)&local_220);
    aVar5 = local_220;
    if (!bVar6) goto LAB_0053bf6c;
    dVar3 = (local_220.p)->radius + actor->radius;
  } while (((dVar3 <= ABS(((local_220.p)->__Pos).X - local_218)) ||
           (dVar3 <= ABS(((local_220.p)->__Pos).Y - local_210))) ||
          ((((actor->flags2).Value | ((local_220.p)->flags2).Value) >> 0x14 & 1) != 0));
  if (((actor->flags6).Value & 2) != 0) {
    (*((local_220.p)->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_224,local_220.p);
    (*(actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_228,actor);
    if (local_224 == local_228) goto LAB_0053bdc7;
  }
  uVar7 = ((aVar5.p)->flags).Value;
  if (((uVar7 & 0x1003) == 2) && (((uVar7 >> 0x14 & 1) == 0 || ((int)(actor->flags).Value < 0)))) {
    if ((((aVar5.p)->flags4).Value & 0x80) == 0) {
      uVar7 = (actor->flags).Value;
      if (aVar5.p == actor || (uVar7 & 1) != 0) goto LAB_0053bdc7;
    }
    else {
      if (aVar5.p == actor) goto LAB_0053bdc7;
      uVar7 = (actor->flags).Value;
    }
    if (((uVar7 >> 0x10 & 1) != 0) && (pAVar2 = (actor->target).field_0.p, pAVar2 != (AActor *)0x0))
    {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (aVar5.p == pAVar2) goto LAB_0053bdc7;
      }
      else {
        (actor->target).field_0.p = (AActor *)0x0;
      }
    }
    dVar3 = (actor->__Pos).Z;
    dVar1 = ((aVar5.p)->__Pos).Z;
    dVar4 = (aVar5.p)->Height + dVar1;
    if (((dVar3 <= dVar4) && (dVar1 < dVar3 + actor->Height)) &&
       ((aVar8.p == (AActor *)0x0 || quick || (((aVar8.p)->__Pos).Z + (aVar8.p)->Height <= dVar4))))
    goto LAB_0053bf4c;
  }
  goto LAB_0053bdc7;
LAB_0053bf4c:
  aVar8 = aVar5;
  if (quick) {
LAB_0053bf6c:
    if (pOnmobj != (AActor **)0x0) {
      *pOnmobj = (AActor *)aVar8;
    }
    TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
              (&local_1d0.blockIterator.DynHash);
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_1f8.data);
    return aVar8.p == (AActor *)0x0;
  }
  goto LAB_0053bdb6;
}

Assistant:

bool P_TestMobjZ(AActor *actor, bool quick, AActor **pOnmobj)
{
	AActor *onmobj = NULL;
	if (actor->flags & MF_NOCLIP)
	{
		if (pOnmobj) *pOnmobj = NULL;
		return true;
	}

	FPortalGroupArray check;
	FMultiBlockThingsIterator it(check, actor, -1, true);
	FMultiBlockThingsIterator::CheckResult cres;

	while (it.Next(&cres))
	{
		AActor *thing = cres.thing;

		double blockdist = thing->radius + actor->radius;
		if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		{
			continue;
		}
		if ((actor->flags2 | thing->flags2) & MF2_THRUACTORS)
		{
			continue;
		}
		if ((actor->flags6 & MF6_THRUSPECIES) && (thing->GetSpecies() == actor->GetSpecies()))
		{
			continue;
		}
		if (!(thing->flags & MF_SOLID))
		{ // Can't hit thing
			continue;
		}
		if (thing->flags & (MF_SPECIAL | MF_NOCLIP))
		{ // [RH] Specials and noclippers don't block moves
			continue;
		}
		if (thing->flags & (MF_CORPSE))
		{ // Corpses need a few more checks
			if (!(actor->flags & MF_ICECORPSE))
				continue;
		}
		if (!(thing->flags4 & MF4_ACTLIKEBRIDGE) && (actor->flags & MF_SPECIAL))
		{ // [RH] Only bridges block pickup items
			continue;
		}
		if (thing == actor)
		{ // Don't clip against self
			continue;
		}
		if ((actor->flags & MF_MISSILE) && (thing == actor->target))
		{ // Don't clip against whoever shot the missile.
			continue;
		}
		if (actor->Z() > thing->Top())
		{ // over thing
			continue;
		}
		else if (actor->Top() <= thing->Z())
		{ // under thing
			continue;
		}
		else if (!quick && onmobj != NULL && thing->Top() < onmobj->Top())
		{ // something higher is in the way
			continue;
		}
		onmobj = thing;
		if (quick) break;
	}

	if (pOnmobj) *pOnmobj = onmobj;
	return onmobj == NULL;
}